

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall google::protobuf::RepeatedField<float>::RemoveLast(RepeatedField<float> *this)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int *__src;
  LongSooRep *pLVar8;
  LongSooRep *pLVar9;
  bool bVar10;
  LongSooRep LStack_a0;
  LongSooRep *pLStack_90;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  uVar3 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  pLVar8 = (LongSooRep *)(ulong)uVar3;
  if (0 < (int)uVar3) {
    bVar10 = (uVar1 & 4) == 0;
    elements(this,bVar10);
    iVar4 = internal::SooRep::size(&this->soo_rep_,bVar10);
    if ((iVar4 != uVar3 - 1) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,uVar3 - 1);
    return;
  }
  RemoveLast();
  uVar1 = pLVar8->elements_int;
  uVar3 = internal::SooRep::size((SooRep *)pLVar8,(uVar1 & 4) == 0);
  pLVar9 = (LongSooRep *)(ulong)uVar3;
  if (0 < (int)uVar3) {
    bVar10 = (uVar1 & 4) == 0;
    RepeatedField<double>::elements((RepeatedField<double> *)pLVar8,bVar10);
    iVar4 = internal::SooRep::size((SooRep *)pLVar8,bVar10);
    if ((iVar4 != uVar3 - 1) && ((pLVar8->elements_int & 4) != 0)) {
      internal::LongSooRep::elements(pLVar8);
    }
    RepeatedField<double>::set_size((RepeatedField<double> *)pLVar8,(uVar1 & 4) == 0,uVar3 - 1);
    return;
  }
  RepeatedField<double>::RemoveLast();
  uVar1 = pLVar9->elements_int;
  pLStack_90 = pLVar8;
  uVar3 = internal::SooRep::size((SooRep *)pLVar9,(uVar1 & 4) == 0);
  pLVar8 = (LongSooRep *)(ulong)uVar3;
  if (0 < (int)uVar3) {
    bVar10 = (uVar1 & 4) == 0;
    RepeatedField<bool>::elements((RepeatedField<bool> *)pLVar9,bVar10);
    iVar4 = internal::SooRep::size((SooRep *)pLVar9,bVar10);
    if ((iVar4 != uVar3 - 1) && ((pLVar9->elements_int & 4) != 0)) {
      internal::LongSooRep::elements(pLVar9);
    }
    RepeatedField<bool>::set_size((RepeatedField<bool> *)pLVar9,(uVar1 & 4) == 0,uVar3 - 1);
    return;
  }
  pLVar9 = &LStack_a0;
  RepeatedField<bool>::RemoveLast();
  if (pLVar9 != pLVar8) {
    uVar1 = pLVar9->elements_int;
    iVar4 = internal::SooRep::size((SooRep *)pLVar9,(uVar1 & 4) == 0);
    if (iVar4 != 0) {
      iVar5 = internal::SooRep::size((SooRep *)pLVar8,(pLVar8->elements_int & 4) == 0);
      iVar5 = iVar5 + iVar4;
      RepeatedField<int>::Reserve((RepeatedField<int> *)pLVar8,iVar5);
      uVar2 = pLVar8->elements_int;
      bVar10 = (uVar2 & 4) == 0;
      piVar7 = RepeatedField<int>::elements((RepeatedField<int> *)pLVar8,bVar10);
      iVar6 = internal::SooRep::size((SooRep *)pLVar8,bVar10);
      if ((iVar6 != iVar5) && ((pLVar8->elements_int & 4) != 0)) {
        internal::LongSooRep::elements(pLVar8);
      }
      RepeatedField<int>::set_size((RepeatedField<int> *)pLVar8,(uVar2 & 4) == 0,iVar5);
      __src = RepeatedField<int>::elements((RepeatedField<int> *)pLVar9,(uVar1 & 4) == 0);
      memcpy(piVar7 + iVar6,__src,(long)iVar4 << 2);
      return;
    }
    return;
  }
  RepeatedField<int>::MergeFrom();
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_GT(old_size, 0);
  elements(is_soo)[old_size - 1].~Element();
  ExchangeCurrentSize(is_soo, old_size - 1);
}